

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmrandgen.cpp
# Opt level: O3

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  bool bVar1;
  CommandOptions *__s1;
  char *__s;
  char *pcVar2;
  int iVar3;
  ui32_t uVar4;
  long lVar5;
  long lVar6;
  string *psVar7;
  CommandOptions *this_00;
  int iVar8;
  
  this->error_flag = true;
  this->format = OF_HEX;
  this->request_size = 0x20;
  this->no_newline_flag = false;
  this->verbose_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->size_provided = false;
  psVar7 = &this->separator;
  (this->separator)._M_dataplus._M_p = (pointer)&(this->separator).field_2;
  this_00 = (CommandOptions *)psVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar7,"-","");
  if (1 < argc) {
    iVar8 = 1;
    do {
      __s1 = (CommandOptions *)argv[iVar8];
      this_00 = __s1;
      iVar3 = strcmp((char *)__s1,"-help");
      if (iVar3 == 0) {
LAB_00110ec4:
        this->help_flag = true;
      }
      else {
        if (*(char *)&((_Alloc_hider *)&__s1->error_flag)->_M_p != '-') {
switchD_00110e93_caseD_6f:
          fprintf(_stderr,"Unrecognized option: %s\n",__s1);
          return;
        }
        bVar1 = __s1->no_newline_flag;
        this_00 = (CommandOptions *)(ulong)(uint)(int)bVar1;
        iVar3 = isalpha((int)bVar1);
        if ((iVar3 == 0) || (__s1->verbose_flag != false)) goto switchD_00110e93_caseD_6f;
        if (bVar1 < 99) {
          if (bVar1 < 0x56) {
            if (bVar1 == true) {
              this->format = OF_BASE64;
            }
            else {
              if (bVar1 != true) goto switchD_00110e93_caseD_6f;
              this->format = OF_CODEWORD;
            }
          }
          else if (bVar1 == true) {
            this->version_flag = true;
          }
          else if (bVar1 == true) {
            iVar8 = iVar8 + 1;
            if ((argc <= iVar8) || (__s = argv[iVar8], *__s == '-')) {
              CommandOptions(this_00);
              return;
            }
            pcVar2 = (char *)(this->separator)._M_string_length;
            strlen(__s);
            this_00 = (CommandOptions *)psVar7;
            std::__cxx11::string::_M_replace((ulong)psVar7,0,pcVar2,(ulong)__s);
          }
          else {
            if (bVar1 != true) goto switchD_00110e93_caseD_6f;
            this->format = OF_BINARY;
          }
        }
        else {
          switch(bVar1) {
          case true:
            this->no_newline_flag = true;
            break;
          case true:
          case true:
          case true:
          case true:
          case true:
          case true:
            goto switchD_00110e93_caseD_6f;
          case true:
            iVar8 = iVar8 + 1;
            if ((argc <= iVar8) ||
               (this_00 = (CommandOptions *)argv[iVar8],
               *(char *)&((_Alloc_hider *)&this_00->error_flag)->_M_p == '-')) {
              CommandOptions(this_00);
              return;
            }
            lVar5 = strtol((char *)this_00,(char **)0x0,10);
            lVar6 = -lVar5;
            if (0 < lVar5) {
              lVar6 = lVar5;
            }
            this->request_size = (ui32_t)lVar6;
            this->size_provided = true;
            break;
          case true:
            this->verbose_flag = true;
            break;
          case true:
            this->format = OF_DICTWORD;
            break;
          case true:
            this->format = OF_HEX;
            break;
          default:
            if (bVar1 != true) {
              if (bVar1 != true) goto switchD_00110e93_caseD_6f;
              goto LAB_00110ec4;
            }
            this->format = OF_CSTRUCT;
          }
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < argc);
  }
  if (this->help_flag != false) {
    return;
  }
  if (this->version_flag != false) {
    return;
  }
  if (this->size_provided == false) {
    if (this->format == OF_CODEWORD) {
      uVar4 = 0x14;
    }
    else {
      if (this->format != OF_DICTWORD) goto LAB_00110fef;
      uVar4 = 0x10;
    }
    this->request_size = uVar4;
  }
  else if (this->request_size == 0) {
    CommandOptions(this_00);
    return;
  }
LAB_00110fef:
  this->error_flag = false;
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), no_newline_flag(false), verbose_flag(false),
    version_flag(false), help_flag(false), format(OF_HEX), request_size(RandBlockSize*2),
    size_provided(false), separator("-")
  {
    for ( int i = 1; i < argc; i++ )
      {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
     
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'b': format = OF_BINARY; break;
	      case 'B': format = OF_BASE64; break;
	      case 'c': format = OF_CSTRUCT; break;
	      case 'C': format = OF_CODEWORD; break;
	      case 'n': no_newline_flag = true; break;
	      case 'h': help_flag = true; break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		request_size = Kumu::xabs(strtol(argv[i], 0, 10));
		size_provided = true;
		break;

	      case 'v': verbose_flag = true; break;
	      case 'V': version_flag = true; break;
	      case 'w': format = OF_DICTWORD; break;

	      case 'W':
		TEST_EXTRA_ARG(i, 'W');
		separator = argv[i];
		break;

	      case 'x': format = OF_HEX; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
	    return;
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( ! size_provided )
      {
	if ( format == OF_CODEWORD )
	  {
	    request_size = 20;
	  }
	else if ( format == OF_DICTWORD )
	  {
	    request_size = 16;
	  }
      }
    else if ( request_size == 0 )
      {
	fprintf(stderr, "Please use a non-zero request size\n");
	return;
      }

    error_flag = false;
  }